

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_client.c
# Opt level: O0

int ssl_write_supported_groups_ext
              (mbedtls_ssl_context *ssl,uchar *buf,uchar *end,int flags,size_t *out_len)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  mbedtls_ecp_group_id mVar4;
  char *pcVar5;
  long lVar6;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar7;
  ushort *puStack_58;
  int propose_group;
  uint16_t *group_list;
  size_t named_group_list_len;
  uchar *named_group_list;
  uchar *p;
  size_t *out_len_local;
  int flags_local;
  uchar *end_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  puStack_58 = (ushort *)mbedtls_ssl_get_groups(ssl);
  *out_len = 0;
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_client.c"
             ,0xe6,"client hello, adding supported_groups extension");
  iVar3 = mbedtls_ssl_chk_buf_ptr(buf,end,6);
  if (iVar3 == 0) {
    named_group_list = buf + 6;
    if (puStack_58 == (ushort *)0x0) {
      ssl_local._4_4_ = -0x5e80;
    }
    else {
      for (; *puStack_58 != 0; puStack_58 = puStack_58 + 1) {
        bVar2 = false;
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_client.c"
                   ,0xf9,"got supported group(%04x)",(ulong)*puStack_58);
        if ((((flags & 1U) != 0) &&
            (iVar3 = mbedtls_ssl_tls12_named_group_is_ecdhe(*puStack_58), iVar3 != 0)) &&
           (mVar4 = mbedtls_ssl_get_ecp_group_id_from_tls_id(*puStack_58),
           mVar4 != MBEDTLS_ECP_DP_NONE)) {
          bVar2 = true;
        }
        uVar7 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
        if (bVar2) {
          iVar3 = mbedtls_ssl_chk_buf_ptr(named_group_list,end,2);
          if (iVar3 != 0) {
            return -0x6a00;
          }
          mbedtls_put_unaligned_uint16(named_group_list,*puStack_58 << 8 | *puStack_58 >> 8);
          named_group_list = named_group_list + 2;
          pcVar5 = mbedtls_ssl_named_group_to_str(*puStack_58);
          in_stack_ffffffffffffff88 = CONCAT44(uVar7,(uint)*puStack_58);
          mbedtls_debug_print_msg
                    (ssl,3,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_client.c"
                     ,0x11b,"NamedGroup: %s ( %x )",pcVar5,in_stack_ffffffffffffff88);
        }
      }
      lVar6 = (long)named_group_list - (long)(buf + 6);
      if (lVar6 == 0) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_client.c"
                   ,0x122,"No group available.");
        ssl_local._4_4_ = -0x6c00;
      }
      else {
        mbedtls_put_unaligned_uint16(buf,0xa00);
        uVar1 = (ushort)lVar6;
        mbedtls_put_unaligned_uint16(buf + 2,(uVar1 + 2) * 0x100 | (ushort)(uVar1 + 2) >> 8);
        mbedtls_put_unaligned_uint16(buf + 4,uVar1 << 8 | uVar1 >> 8);
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_client.c"
                   ,0x12e,"Supported groups extension",buf + 4,lVar6 + 2);
        *out_len = (long)named_group_list - (long)buf;
        ssl_local._4_4_ = 0;
      }
    }
  }
  else {
    ssl_local._4_4_ = -0x6a00;
  }
  return ssl_local._4_4_;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_write_supported_groups_ext(mbedtls_ssl_context *ssl,
                                          unsigned char *buf,
                                          const unsigned char *end,
                                          int flags,
                                          size_t *out_len)
{
    unsigned char *p = buf;
    unsigned char *named_group_list; /* Start of named_group_list */
    size_t named_group_list_len;     /* Length of named_group_list */
    const uint16_t *group_list = mbedtls_ssl_get_groups(ssl);

    *out_len = 0;

    MBEDTLS_SSL_DEBUG_MSG(3, ("client hello, adding supported_groups extension"));

    /* Check if we have space for header and length fields:
     * - extension_type            (2 bytes)
     * - extension_data_length     (2 bytes)
     * - named_group_list_length   (2 bytes)
     */
    MBEDTLS_SSL_CHK_BUF_PTR(p, end, 6);
    p += 6;

    named_group_list = p;

    if (group_list == NULL) {
        return MBEDTLS_ERR_SSL_BAD_CONFIG;
    }

    for (; *group_list != 0; group_list++) {
        int propose_group = 0;

        MBEDTLS_SSL_DEBUG_MSG(3, ("got supported group(%04x)", *group_list));

#if defined(MBEDTLS_SSL_TLS1_3_KEY_EXCHANGE_MODE_SOME_EPHEMERAL_ENABLED)
        if (flags & SSL_WRITE_SUPPORTED_GROUPS_EXT_TLS1_3_FLAG) {
#if defined(PSA_WANT_ALG_ECDH)
            if (mbedtls_ssl_tls13_named_group_is_ecdhe(*group_list) &&
                (mbedtls_ssl_get_ecp_group_id_from_tls_id(*group_list) !=
                 MBEDTLS_ECP_DP_NONE)) {
                propose_group = 1;
            }
#endif
#if defined(PSA_WANT_ALG_FFDH)
            if (mbedtls_ssl_tls13_named_group_is_ffdh(*group_list)) {
                propose_group = 1;
            }
#endif
        }
#endif /* MBEDTLS_SSL_TLS1_3_KEY_EXCHANGE_MODE_SOME_EPHEMERAL_ENABLED */

#if defined(MBEDTLS_SSL_TLS1_2_SOME_ECC)
        if ((flags & SSL_WRITE_SUPPORTED_GROUPS_EXT_TLS1_2_FLAG) &&
            mbedtls_ssl_tls12_named_group_is_ecdhe(*group_list) &&
            (mbedtls_ssl_get_ecp_group_id_from_tls_id(*group_list) !=
             MBEDTLS_ECP_DP_NONE)) {
            propose_group = 1;
        }
#endif /* MBEDTLS_SSL_TLS1_2_SOME_ECC */

        if (propose_group) {
            MBEDTLS_SSL_CHK_BUF_PTR(p, end, 2);
            MBEDTLS_PUT_UINT16_BE(*group_list, p, 0);
            p += 2;
            MBEDTLS_SSL_DEBUG_MSG(3, ("NamedGroup: %s ( %x )",
                                      mbedtls_ssl_named_group_to_str(*group_list),
                                      *group_list));
        }
    }

    /* Length of named_group_list */
    named_group_list_len = p - named_group_list;
    if (named_group_list_len == 0) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("No group available."));
        return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
    }

    /* Write extension_type */
    MBEDTLS_PUT_UINT16_BE(MBEDTLS_TLS_EXT_SUPPORTED_GROUPS, buf, 0);
    /* Write extension_data_length */
    MBEDTLS_PUT_UINT16_BE(named_group_list_len + 2, buf, 2);
    /* Write length of named_group_list */
    MBEDTLS_PUT_UINT16_BE(named_group_list_len, buf, 4);

    MBEDTLS_SSL_DEBUG_BUF(3, "Supported groups extension",
                          buf + 4, named_group_list_len + 2);

    *out_len = p - buf;

#if defined(MBEDTLS_SSL_PROTO_TLS1_3)
    mbedtls_ssl_tls13_set_hs_sent_ext_mask(
        ssl, MBEDTLS_TLS_EXT_SUPPORTED_GROUPS);
#endif /* MBEDTLS_SSL_PROTO_TLS1_3 */

    return 0;
}